

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::utlru_cache(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
              *this,milliseconds ttl,size_t capacity,float max_load_factor)

{
  size_type sVar1;
  iterator iVar2;
  iterator __last;
  list<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  allocator<unsigned_long> local_35 [16];
  allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  local_25;
  float local_24;
  size_t sStack_20;
  float max_load_factor_local;
  size_t capacity_local;
  utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  milliseconds ttl_local;
  
  local_24 = max_load_factor;
  sStack_20 = capacity;
  capacity_local = (size_t)this;
  this_local = (utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)ttl.__r;
  mutex<(cappuccino::thread_safe)1,_std::mutex>::mutex(&this->m_lock);
  sVar1 = sStack_20;
  (this->m_ttl).__r = (rep)this_local;
  this->m_used_size = 0;
  std::
  allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::allocator(&local_25);
  std::
  vector<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::vector(&this->m_elements,sVar1,&local_25);
  std::
  allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::~allocator(&local_25);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map(&this->m_keyed_elements);
  sVar1 = sStack_20;
  std::allocator<unsigned_long>::allocator(local_35);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            (&this->m_lru_list,sVar1,local_35);
  std::allocator<unsigned_long>::~allocator(local_35);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list(&this->m_ttl_list);
  std::_List_iterator<unsigned_long>::_List_iterator(&this->m_lru_end);
  this_00 = &this->m_lru_list;
  iVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
  __last = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
  std::iota<std::_List_iterator<unsigned_long>,int>
            ((_List_iterator<unsigned_long>)iVar2._M_node,
             (_List_iterator<unsigned_long>)__last._M_node,0);
  iVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
  (this->m_lru_end)._M_node = iVar2._M_node;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::max_load_factor(&this->m_keyed_elements,local_24);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::reserve(&this->m_keyed_elements,sStack_20);
  return;
}

Assistant:

utlru_cache(std::chrono::milliseconds ttl, size_t capacity, float max_load_factor = 1.0f)
        : m_ttl(ttl),
          m_elements(capacity),
          m_lru_list(capacity)
    {
        std::iota(m_lru_list.begin(), m_lru_list.end(), 0);
        m_lru_end = m_lru_list.begin();

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }